

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

void __thiscall
t_json_generator::write_type_spec_entry(t_json_generator *this,char *name,t_type *ttype)

{
  allocator local_41;
  string local_40;
  t_type *local_20;
  t_type *ttype_local;
  char *name_local;
  t_json_generator *this_local;
  
  local_20 = ttype;
  ttype_local = (t_type *)name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,name,&local_41);
  write_key_and(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  write_type_spec(this,local_20);
  return;
}

Assistant:

void t_json_generator::write_type_spec_entry(const char* name, t_type* ttype) {
  write_key_and(name);
  write_type_spec(ttype);
}